

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_CRUNCH(effect_handler_context_t_conflict *context)

{
  uint32_t uVar1;
  effect_handler_context_t_conflict *context_local;
  
  uVar1 = Rand_div(2);
  if (uVar1 == 0) {
    msg("It\'s crunchy.");
  }
  else {
    msg("It nearly breaks your tooth!");
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_CRUNCH(effect_handler_context_t *context)
{
	if (one_in_(2))
		msg("It's crunchy.");
	else
		msg("It nearly breaks your tooth!");
	context->ident = true;
	return true;
}